

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test *this_00;
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x17b);
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test::
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherType)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultMallocAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Allocation/deallocation type mismatch"));
    CHECK(reporter->message->contains("   allocated at file: ALLOC.c line: 10 size: 100 type: new []"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}